

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::num_parse
          (num_parse<wchar_t> *this,cdata *d,size_t refs)

{
  pointer pcVar1;
  
  *(uint *)&this->field_0x8 = (uint)(refs != 0);
  *(undefined ***)this = &PTR__num_parse_001d1540;
  icu_70::Locale::Locale(&this->loc_,&d->locale);
  (this->enc_)._M_dataplus._M_p = (pointer)&(this->enc_).field_2;
  pcVar1 = (d->encoding)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->enc_,pcVar1,pcVar1 + (d->encoding)._M_string_length);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }